

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShutDownRestartTest.cpp
# Opt level: O1

int ShutDownRestartTest(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  EStatusCode EVar4;
  LogConfiguration *pLVar5;
  EncryptionOptions *pEVar6;
  PDFUsedFont *inFontReference;
  PDFPage *pPVar7;
  PageContentContext *pPVar8;
  PDFFormXObject *this;
  XObjectContentContext *this_00;
  ResourcesDictionary *this_01;
  string *inOptionalModifiedFile;
  int extraout_EDX;
  int extraout_EDX_00;
  PageContentContext *pPVar9;
  string *inXObjectName;
  int iVar10;
  PDFCreationSettings *inPDFCreationSettings;
  int in_R9D;
  string formXObjectName;
  PDFWriter pdfWriterA;
  string local_1018;
  string local_ff8;
  undefined1 local_fd8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fb8;
  _Alloc_hider local_fa0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f90;
  string local_f78;
  ObjectIDType local_f58;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter local_ee0;
  
  PDFWriter::PDFWriter(&local_ee0);
  local_1018._M_dataplus._M_p = (pointer)&local_1018.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1018,"SimpleContentShutdownRestart.pdf","");
  BuildRelativeOutputPath(&local_ff8,argv,&local_1018);
  pLVar5 = LogConfiguration::DefaultLogConfiguration();
  pEVar6 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar6->ShouldEncrypt;
  pcVar2 = (pEVar6->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar2,pcVar2 + (pEVar6->UserPassword)._M_string_length);
  local_f08 = pEVar6->UserProtectionOptionsFlag;
  pcVar2 = (pEVar6->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar2,pcVar2 + (pEVar6->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_fd8,true,true,(EncryptionOptions *)local_f30,false);
  inPDFCreationSettings = (PDFCreationSettings *)local_fd8;
  EVar4 = PDFWriter::StartPDF(&local_ee0,&local_ff8,ePDFVersion13,pLVar5,inPDFCreationSettings);
  iVar10 = (int)inPDFCreationSettings;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa0._M_p != &local_f90) {
    operator_delete(local_fa0._M_p,local_f90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd8._16_8_ != &local_fb8) {
    operator_delete((void *)local_fd8._16_8_,local_fb8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  paVar1 = &local_ff8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff8._M_dataplus._M_p != paVar1) {
    operator_delete(local_ff8._M_dataplus._M_p,local_ff8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
    operator_delete(local_1018._M_dataplus._M_p,local_1018.field_2._M_allocated_capacity + 1);
  }
  if (EVar4 == eSuccess) {
    pPVar7 = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(pPVar7);
    PDFRectangle::PDFRectangle((PDFRectangle *)local_fd8,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(pPVar7,(PDFRectangle *)local_fd8);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_fd8);
    local_f78._M_dataplus._M_p = (pointer)&local_f78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f78,"fonts/arial.ttf","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ff8,argv[1],(allocator<char> *)&local_f50);
    LocalPathToFileURL((FileURL *)local_fd8,&local_ff8);
    RelativeURLToLocalPath(&local_1018,(FileURL *)local_fd8,&local_f78);
    FileURL::~FileURL((FileURL *)local_fd8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ff8._M_dataplus._M_p != paVar1) {
      operator_delete(local_ff8._M_dataplus._M_p,local_ff8.field_2._M_allocated_capacity + 1);
    }
    inFontReference = PDFWriter::GetFontForFile(&local_ee0,&local_1018,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
      operator_delete(local_1018._M_dataplus._M_p,local_1018.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
      operator_delete(local_f78._M_dataplus._M_p,local_f78.field_2._M_allocated_capacity + 1);
    }
    if (inFontReference == (PDFUsedFont *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to create font object for arial.ttf\n",0x2b);
    }
    else {
      pPVar8 = PDFWriter::StartPageContentContext(&local_ee0,pPVar7);
      if (pPVar8 != (PageContentContext *)0x0) {
        AbstractContentContext::q(&pPVar8->super_AbstractContentContext);
        AbstractContentContext::k(&pPVar8->super_AbstractContentContext,100.0,0.0,0.0,0.0);
        AbstractContentContext::re(&pPVar8->super_AbstractContentContext,100.0,500.0,100.0,100.0);
        AbstractContentContext::f(&pPVar8->super_AbstractContentContext);
        AbstractContentContext::Q(&pPVar8->super_AbstractContentContext);
        pPVar9 = pPVar8;
        EVar4 = PDFWriter::PausePageContentContext(&local_ee0,pPVar8);
        if (EVar4 == eSuccess) {
          AbstractContentContext::q(&pPVar8->super_AbstractContentContext);
          AbstractContentContext::k(&pPVar8->super_AbstractContentContext,0.0,100.0,100.0,0.0);
          AbstractContentContext::re(&pPVar8->super_AbstractContentContext,200.0,600.0,200.0,100.0);
          AbstractContentContext::f(&pPVar8->super_AbstractContentContext);
          AbstractContentContext::Q(&pPVar8->super_AbstractContentContext);
          AbstractContentContext::q(&pPVar8->super_AbstractContentContext);
          AbstractContentContext::G(&pPVar8->super_AbstractContentContext,0.5);
          AbstractContentContext::w(&pPVar8->super_AbstractContentContext,3.0);
          AbstractContentContext::m
                    (&pPVar8->super_AbstractContentContext,pPVar9,extraout_EDX,&pLVar5->ShouldLog,
                     iVar10,in_R9D);
          AbstractContentContext::l(&pPVar8->super_AbstractContentContext,400.0,400.0);
          AbstractContentContext::S(&pPVar8->super_AbstractContentContext);
          AbstractContentContext::Q(&pPVar8->super_AbstractContentContext);
          AbstractContentContext::BT(&pPVar8->super_AbstractContentContext);
          AbstractContentContext::k(&pPVar8->super_AbstractContentContext,0.0,0.0,0.0,1.0);
          AbstractContentContext::Tf(&pPVar8->super_AbstractContentContext,inFontReference,1.0);
          AbstractContentContext::Tm
                    (&pPVar8->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
          pcVar2 = local_fd8 + 0x10;
          local_fd8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_fd8,"hello world","");
          EVar4 = AbstractContentContext::Tj
                            (&pPVar8->super_AbstractContentContext,(string *)local_fd8);
          if ((pointer)local_fd8._0_8_ != pcVar2) {
            operator_delete((void *)local_fd8._0_8_,(ulong)(local_fd8._16_8_ + 1));
          }
          if (EVar4 != eSuccess) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Could not find some of the glyphs for this font",0x2f)
            ;
          }
          AbstractContentContext::ET(&pPVar8->super_AbstractContentContext);
          EVar4 = PDFWriter::EndPageContentContext(&local_ee0,pPVar8);
          if (EVar4 == eSuccess) {
            EVar4 = PDFWriter::WritePageAndRelease(&local_ee0,pPVar7);
            if (EVar4 == eSuccess) {
              local_ff8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_ff8,"ShutDownRestartState.txt","");
              BuildRelativeOutputPath((string *)local_fd8,argv,&local_ff8);
              EVar4 = PDFWriter::Shutdown(&local_ee0,(string *)local_fd8);
              if ((pointer)local_fd8._0_8_ != pcVar2) {
                operator_delete((void *)local_fd8._0_8_,(ulong)(local_fd8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ff8._M_dataplus._M_p != paVar1) {
                operator_delete(local_ff8._M_dataplus._M_p,
                                local_ff8.field_2._M_allocated_capacity + 1);
              }
              if (EVar4 == eSuccess) {
                EVar4 = eSuccess;
                bVar3 = true;
                goto LAB_00151320;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to shutdown library\n",0x1b);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to write page\n",0x15);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"failed to end page content context\n",0x23);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"failed to pause page content context\n",0x25);
        }
        goto LAB_0015131d;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"failed to create content context for page\n",0x2a);
    }
    EVar4 = eFailure;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to start PDF\n",0x14);
  }
LAB_0015131d:
  bVar3 = false;
LAB_00151320:
  PDFWriter::~PDFWriter(&local_ee0);
  if (bVar3) {
    PDFWriter::PDFWriter(&local_ee0);
    local_ff8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ff8,"SimpleContentShutdownRestart.pdf","");
    BuildRelativeOutputPath((string *)local_fd8,argv,&local_ff8);
    local_f78._M_dataplus._M_p = (pointer)&local_f78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f78,"ShutDownRestartState.txt","");
    BuildRelativeOutputPath(&local_1018,argv,&local_f78);
    local_f50._M_dataplus._M_p = (pointer)&local_f50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f50,"");
    pLVar5 = LogConfiguration::DefaultLogConfiguration();
    inOptionalModifiedFile = &local_f50;
    EVar4 = PDFWriter::ContinuePDF
                      (&local_ee0,(string *)local_fd8,&local_1018,inOptionalModifiedFile,pLVar5);
    iVar10 = (int)pLVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
      operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
      operator_delete(local_1018._M_dataplus._M_p,local_1018.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
      operator_delete(local_f78._M_dataplus._M_p,local_f78.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_fd8._0_8_ != local_fd8 + 0x10) {
      operator_delete((void *)local_fd8._0_8_,(ulong)(local_fd8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ff8._M_dataplus._M_p != paVar1) {
      operator_delete(local_ff8._M_dataplus._M_p,local_ff8.field_2._M_allocated_capacity + 1);
    }
    if (EVar4 == eSuccess) {
      pPVar7 = (PDFPage *)operator_new(0x2b8);
      PDFPage::PDFPage(pPVar7);
      PDFRectangle::PDFRectangle((PDFRectangle *)local_fd8,0.0,0.0,595.0,842.0);
      PDFPage::SetMediaBox(pPVar7,(PDFRectangle *)local_fd8);
      PDFRectangle::~PDFRectangle((PDFRectangle *)local_fd8);
      pPVar8 = PDFWriter::StartPageContentContext(&local_ee0,pPVar7);
      if (pPVar8 == (PageContentContext *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"failed to create content context for page\n",0x2a);
      }
      AbstractContentContext::q(&pPVar8->super_AbstractContentContext);
      AbstractContentContext::k(&pPVar8->super_AbstractContentContext,100.0,0.0,0.0,0.0);
      AbstractContentContext::re(&pPVar8->super_AbstractContentContext,100.0,500.0,100.0,100.0);
      AbstractContentContext::f(&pPVar8->super_AbstractContentContext);
      AbstractContentContext::Q(&pPVar8->super_AbstractContentContext);
      EVar4 = PDFWriter::PausePageContentContext(&local_ee0,pPVar8);
      if (EVar4 == eSuccess) {
        PDFRectangle::PDFRectangle((PDFRectangle *)local_fd8,0.0,0.0,200.0,100.0);
        this = PDFWriter::StartFormXObject(&local_ee0,(PDFRectangle *)local_fd8,(double *)0x0);
        PDFRectangle::~PDFRectangle((PDFRectangle *)local_fd8);
        if (this == (PDFFormXObject *)0x0) {
          EVar4 = eFailure;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"failed to create form xobject\n",0x1e);
        }
        else {
          local_f58 = PDFFormXObject::GetObjectID(this);
          this_00 = PDFFormXObject::GetContentContext(this);
          AbstractContentContext::q(&this_00->super_AbstractContentContext);
          AbstractContentContext::k(&this_00->super_AbstractContentContext,0.0,100.0,100.0,0.0);
          AbstractContentContext::re(&this_00->super_AbstractContentContext,0.0,0.0,200.0,100.0);
          AbstractContentContext::f(&this_00->super_AbstractContentContext);
          AbstractContentContext::Q(&this_00->super_AbstractContentContext);
          EVar4 = PDFWriter::EndFormXObjectAndRelease(&local_ee0,this);
          if (EVar4 == eSuccess) {
            this_01 = PDFPage::GetResourcesDictionary(pPVar7);
            ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
                      ((string *)local_fd8,this_01,local_f58);
            AbstractContentContext::q(&pPVar8->super_AbstractContentContext);
            AbstractContentContext::cm
                      (&pPVar8->super_AbstractContentContext,1.0,0.0,0.0,1.0,200.0,600.0);
            inXObjectName = (string *)local_fd8;
            AbstractContentContext::Do(&pPVar8->super_AbstractContentContext,inXObjectName);
            AbstractContentContext::Q(&pPVar8->super_AbstractContentContext);
            AbstractContentContext::q(&pPVar8->super_AbstractContentContext);
            AbstractContentContext::G(&pPVar8->super_AbstractContentContext,0.5);
            AbstractContentContext::w(&pPVar8->super_AbstractContentContext,3.0);
            AbstractContentContext::m
                      (&pPVar8->super_AbstractContentContext,inXObjectName,extraout_EDX_00,
                       (char *)inOptionalModifiedFile,iVar10,in_R9D);
            AbstractContentContext::l(&pPVar8->super_AbstractContentContext,400.0,400.0);
            AbstractContentContext::S(&pPVar8->super_AbstractContentContext);
            AbstractContentContext::Q(&pPVar8->super_AbstractContentContext);
            AbstractContentContext::q(&pPVar8->super_AbstractContentContext);
            AbstractContentContext::cm
                      (&pPVar8->super_AbstractContentContext,1.0,0.0,0.0,1.0,200.0,200.0);
            AbstractContentContext::Do(&pPVar8->super_AbstractContentContext,(string *)local_fd8);
            AbstractContentContext::Q(&pPVar8->super_AbstractContentContext);
            EVar4 = PDFWriter::EndPageContentContext(&local_ee0,pPVar8);
            if (EVar4 == eSuccess) {
              EVar4 = PDFWriter::WritePageAndRelease(&local_ee0,pPVar7);
              if (EVar4 == eSuccess) {
                EVar4 = PDFWriter::EndPDF(&local_ee0);
                if (EVar4 == eSuccess) {
                  EVar4 = eSuccess;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"failed in end PDF\n",0x12);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"failed to write page\n",0x15);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to end page content context\n",0x23);
            }
            if ((undefined1 *)local_fd8._0_8_ != local_fd8 + 0x10) {
              operator_delete((void *)local_fd8._0_8_,(ulong)(local_fd8._16_8_ + 1));
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"failed to write XObject form\n",0x1d);
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"failed to pause page content context\n",0x25);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"failed to restart library\n",0x1a);
    }
    PDFWriter::~PDFWriter(&local_ee0);
  }
  return (int)(EVar4 != eSuccess);
}

Assistant:

int ShutDownRestartTest(int argc, char* argv[])
{
	EStatusCode status; 

	do
	{
		{
			PDFWriter pdfWriterA;
			status = pdfWriterA.StartPDF(BuildRelativeOutputPath(argv,"SimpleContentShutdownRestart.pdf"),ePDFVersion13);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to start PDF\n";
				break;
			}	

			PDFPage* page = new PDFPage();
			page->SetMediaBox(PDFRectangle(0,0,595,842));

			PDFUsedFont* font = pdfWriterA.GetFontForFile(BuildRelativeInputPath(argv,"fonts/arial.ttf"));
			if(!font)
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to create font object for arial.ttf\n";
				break;
			}

			PageContentContext* contentContext = pdfWriterA.StartPageContentContext(page);
			if(NULL == contentContext)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create content context for page\n";
				break;
			}

			// draw a 100X100 points cyan square
			contentContext->q();
			contentContext->k(100,0,0,0);
			contentContext->re(100,500,100,100);
			contentContext->f();
			contentContext->Q();

			// force stream change
			status = pdfWriterA.PausePageContentContext(contentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to pause page content context\n";
				break;
			}

			// draw a 200X100 points red rectangle
			contentContext->q();
			contentContext->k(0,100,100,0);
			contentContext->re(200,600,200,100);
			contentContext->f();
			contentContext->Q();

			// draw a gray line
			contentContext->q();
			contentContext->G(0.5);
			contentContext->w(3);
			contentContext->m(200,600);
			contentContext->l(400,400);
			contentContext->S();
			contentContext->Q();

			// Draw some text
			contentContext->BT();
			contentContext->k(0,0,0,1);
			contentContext->Tf(font,1);
			contentContext->Tm(30,0,0,30,78.4252,662.8997);

			EStatusCode encodingStatus = contentContext->Tj("hello world");
			if(encodingStatus != PDFHummus::eSuccess)
				cout<<"Could not find some of the glyphs for this font";

			// continue even if failed...want to see how it looks like
			contentContext->ET();
				
			status = pdfWriterA.EndPageContentContext(contentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to end page content context\n";
				break;
			}

			status = pdfWriterA.WritePageAndRelease(page);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write page\n";
				break;
			}


			status = pdfWriterA.Shutdown(BuildRelativeOutputPath(argv,"ShutDownRestartState.txt"));
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to shutdown library\n";
				break;
			}

		}
		{
			PDFWriter pdfWriterB;
			status = pdfWriterB.ContinuePDF(
                            BuildRelativeOutputPath(argv,"SimpleContentShutdownRestart.pdf"),
                            BuildRelativeOutputPath(argv,"ShutDownRestartState.txt")
                    );
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to restart library\n";
				break;
			}	

			PDFPage* page = new PDFPage();
			page->SetMediaBox(PDFRectangle(0,0,595,842));

			PageContentContext* pageContentContext = pdfWriterB.StartPageContentContext(page);
			if(NULL == pageContentContext)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create content context for page\n";
			}

			// draw a 100X100 points cyan square
			pageContentContext->q();
			pageContentContext->k(100,0,0,0);
			pageContentContext->re(100,500,100,100);
			pageContentContext->f();
			pageContentContext->Q();

			// pause stream to start writing a form xobject
			status = pdfWriterB.PausePageContentContext(pageContentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to pause page content context\n";
				break;
			}

			// define an xobject form to draw a 200X100 points red rectangle
			PDFFormXObject* xobjectForm = pdfWriterB.StartFormXObject(PDFRectangle(0,0,200,100));
			if(!xobjectForm)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create form xobject\n";
				break;
			}
			ObjectIDType formObjectID = xobjectForm->GetObjectID();

			XObjectContentContext* xobjectContentContext = xobjectForm->GetContentContext();
			xobjectContentContext->q();
			xobjectContentContext->k(0,100,100,0);
			xobjectContentContext->re(0,0,200,100);
			xobjectContentContext->f();
			xobjectContentContext->Q();

			status = pdfWriterB.EndFormXObjectAndRelease(xobjectForm);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write XObject form\n";
				break;
			}

			string formXObjectName = page->GetResourcesDictionary().AddFormXObjectMapping(formObjectID);

			// continue page drawing, place the form in 200,600
			pageContentContext->q();
			pageContentContext->cm(1,0,0,1,200,600);
			pageContentContext->Do(formXObjectName);
			pageContentContext->Q();

			// draw a gray line
			pageContentContext->q();
			pageContentContext->G(0.5);
			pageContentContext->w(3);
			pageContentContext->m(200,600);
			pageContentContext->l(400,400);
			pageContentContext->S();
			pageContentContext->Q();

			// place the form in another location
			pageContentContext->q();
			pageContentContext->cm(1,0,0,1,200,200);
			pageContentContext->Do(formXObjectName);
			pageContentContext->Q();

			status = pdfWriterB.EndPageContentContext(pageContentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to end page content context\n";
				break;
			}

			status = pdfWriterB.WritePageAndRelease(page);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write page\n";
				break;
			}

			status = pdfWriterB.EndPDF();
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed in end PDF\n";
				break;
			}
		}
	}while(false);
	return status == eSuccess ? 0:1;

}